

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPile.cpp
# Opt level: O1

void __thiscall
solitaire::piles::TableauPile::Snapshot::Snapshot
          (Snapshot *this,shared_ptr<solitaire::piles::TableauPile> *tableauPile,Cards *pileCards,
          uint topCoveredCardPosition)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Snapshot)._vptr_Snapshot = (_func_int **)&PTR__Snapshot_00333ad8;
  (this->tableauPile).super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (tableauPile->
           super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->tableauPile).super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (tableauPile->
           super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (tableauPile->super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->tableauPile).super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (tableauPile->super___shared_ptr<solitaire::piles::TableauPile,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  (this->pileCards).
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pileCards->
       super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->pileCards).
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pileCards->
       super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->pileCards).
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pileCards->
       super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pileCards->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pileCards->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pileCards->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->topCoveredCardPosition = topCoveredCardPosition;
  return;
}

Assistant:

TableauPile::Snapshot::Snapshot(
    std::shared_ptr<TableauPile> tableauPile,
    Cards pileCards, unsigned topCoveredCardPosition):
    tableauPile {std::move(tableauPile)},
    pileCards {std::move(pileCards)},
    topCoveredCardPosition {std::move(topCoveredCardPosition)} {
}